

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_endec.hxx
# Opt level: O0

void __thiscall
cryptox::
evp_cipher_context<cryptox::symmetric_algorithm<&EVP_aes_192_cbc>,&EVP_DecryptInit_ex,&EVP_DecryptUpdate,&EVP_DecryptFinal_ex>
::
evp_cipher_context<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
          (evp_cipher_context<cryptox::symmetric_algorithm<&EVP_aes_192_cbc>,&EVP_DecryptInit_ex,&EVP_DecryptUpdate,&EVP_DecryptFinal_ex>
           *this,__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                 key_first,
          __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          key_last,__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                   iv_first,
          __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          iv_last)

{
  int iVar1;
  size_t sVar2;
  EVP_CIPHER_CTX *pEVar3;
  source_location local_100;
  evp_error local_e8;
  EVP_CIPHER *local_b0;
  EVP_CIPHER *cipher;
  uchar *local_a0;
  uchar local_98 [8];
  uint8_t iv [16];
  uchar local_78 [8];
  uint8_t key [64];
  evp_cipher_context<cryptox::symmetric_algorithm<&EVP_aes_192_cbc>,_&EVP_DecryptInit_ex,_&EVP_DecryptUpdate,_&EVP_DecryptFinal_ex>
  *this_local;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  iv_last_local;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  iv_first_local;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  key_last_local;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  key_first_local;
  
  sVar2 = symmetric_algorithm<&EVP_aes_192_cbc>::block_size();
  *(size_t *)(this + 8) = sVar2;
  *(undefined8 *)(this + 0x10) = 0;
  *(undefined8 *)(this + 0x18) = 0;
  iv._8_8_ = key_last._M_current;
  std::
  copy<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,unsigned_char*>
            (key_first,key_last,local_78);
  cipher = (EVP_CIPHER *)iv_last._M_current;
  local_a0 = iv_first._M_current;
  std::
  copy<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,unsigned_char*>
            (iv_first,iv_last,local_98);
  pEVar3 = EVP_CIPHER_CTX_new();
  *(EVP_CIPHER_CTX **)this = pEVar3;
  local_b0 = (EVP_CIPHER *)symmetric_algorithm<&EVP_aes_192_cbc>::cipher();
  iVar1 = EVP_DecryptInit_ex(*(EVP_CIPHER_CTX **)this,local_b0,(ENGINE *)0x0,local_78,local_98);
  if (iVar1 != 1) {
    local_e8._32_8_ = 0;
    local_e8._40_8_ = 0;
    local_e8._16_8_ = 0;
    local_e8._24_8_ = 0;
    local_e8._0_8_ = 0;
    local_e8._8_8_ = 0;
    evp_error::evp_error(&local_e8);
    boost::source_location::source_location
              (&local_100,
               "/workspace/llm4binary/github/license_c_cmakelists/madera[P]cryptox/include/cryptox/symmetric/basic_endec.hxx"
               ,0x3b,
               "cryptox::evp_cipher_context<cryptox::symmetric_algorithm<&EVP_aes_192_cbc>, &EVP_DecryptInit_ex, &EVP_DecryptUpdate, &EVP_DecryptFinal_ex>::evp_cipher_context(KeyInput, KeyInput, IVInput, IVInput) [Algorithm = cryptox::symmetric_algorithm<&EVP_aes_192_cbc>, InitFx = &EVP_DecryptInit_ex, UpdateFx = &EVP_DecryptUpdate, FinalFx = &EVP_DecryptFinal_ex, KeyInput = __gnu_cxx::__normal_iterator<const unsigned char *, std::vector<unsigned char>>, IVInput = __gnu_cxx::__normal_iterator<const unsigned char *, std::vector<unsigned char>>]"
               ,0);
    boost::throw_exception<cryptox::evp_error>(&local_e8,&local_100);
  }
  return;
}

Assistant:

evp_cipher_context(KeyInput key_first, KeyInput key_last,
		                    IVInput  iv_first,  IVInput  iv_last)
		 : _total_input(0),
		   _total_output(0) {
			std::uint8_t key[EVP_MAX_KEY_LENGTH];
			std::copy(key_first, key_last, key);

			std::uint8_t iv[EVP_MAX_IV_LENGTH];
			std::copy(iv_first, iv_last, iv);

			_context = EVP_CIPHER_CTX_new();

			const EVP_CIPHER* cipher = Algorithm::cipher();
			if (InitFx(_context, cipher, 0, key, iv) != 1)
				BOOST_THROW_EXCEPTION(evp_error());
		}